

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  SQSharedState *__n;
  SQSharedState *__n_00;
  SQSharedState *this_00;
  bool bVar1;
  SQChar *pSVar2;
  SQString *x;
  SQObjectPtr b;
  SQObjectPtr a;
  
  a.super_SQObject._type = OT_NULL;
  a.super_SQObject._unVal.pTable = (SQTable *)0x0;
  b.super_SQObject._type = OT_NULL;
  b.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = ToString(this,str,&a);
  if (bVar1) {
    bVar1 = ToString(this,obj,&b);
    if (bVar1) {
      __n = ((a.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable._sharedstate;
      __n_00 = ((b.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
               _sharedstate;
      pSVar2 = SQSharedState::GetScratchPad
                         (this->_sharedstate,
                          (SQInteger)
                          ((long)&__n->_metamethods + (long)((long)&__n_00->_metamethods + 1)));
      memcpy(pSVar2,&(a.super_SQObject._unVal.pTable)->_firstfree,(size_t)__n);
      memcpy(pSVar2 + (long)__n,&(b.super_SQObject._unVal.pTable)->_firstfree,(size_t)__n_00);
      this_00 = this->_sharedstate;
      pSVar2 = SQSharedState::GetScratchPad(this_00,-1);
      x = SQString::Create(this_00,pSVar2,(long)&__n->_metamethods + (long)&__n_00->_metamethods);
      bVar1 = true;
      SQObjectPtr::operator=(dest,x);
      goto LAB_00124875;
    }
  }
  bVar1 = false;
LAB_00124875:
  SQObjectPtr::~SQObjectPtr(&b);
  SQObjectPtr::~SQObjectPtr(&a);
  return bVar1;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
    SQChar *s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
    return true;
}